

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  string err;
  string warn;
  Stage stage;
  string local_16e8;
  string local_16c8;
  string local_16a8;
  Stage local_1688;
  
  local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1688._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1688.name._M_dataplus._M_p = (pointer)&local_1688.name.field_2;
  local_1688.name._M_string_length = 0;
  local_1688.name.field_2._M_local_buf[0] = '\0';
  local_1688.default_root_node = -1;
  local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1688._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tinyusdz::LayerMetas::LayerMetas(&local_1688.stage_metas);
  local_1688._err._M_dataplus._M_p = (pointer)&local_1688._err.field_2;
  local_1688._err._M_string_length = 0;
  local_1688._err.field_2._M_local_buf[0] = '\0';
  local_1688._warn._M_dataplus._M_p = (pointer)&local_1688._warn.field_2;
  local_1688._warn._M_string_length = 0;
  local_1688._warn.field_2._M_local_buf[0] = '\0';
  local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1688._dirty = true;
  local_1688._prim_id_dirty = true;
  local_1688._prim_id_allocator.freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1688._prim_id_allocator.freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1688._prim_id_allocator.freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1688._prim_id_allocator.counter_ = 1;
  local_1688._prim_id_allocator.dirty_ = true;
  local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1688._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1688._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SimpleScene(&local_1688);
  local_16c8._M_string_length = 0;
  local_16c8.field_2._M_local_buf[0] = '\0';
  local_16e8._M_string_length = 0;
  local_16e8.field_2._M_local_buf[0] = '\0';
  local_16e8._M_dataplus._M_p = (pointer)&local_16e8.field_2;
  local_16c8._M_dataplus._M_p = (pointer)&local_16c8.field_2;
  local_16a8._M_dataplus._M_p = (pointer)&local_16a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16a8,"output.usda","");
  bVar1 = tinyusdz::usda::SaveAsUSDA(&local_16a8,&local_1688,&local_16c8,&local_16e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a8._M_dataplus._M_p != &local_16a8.field_2) {
    operator_delete(local_16a8._M_dataplus._M_p,local_16a8.field_2._M_allocated_capacity + 1);
  }
  if (local_16c8._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARN: ",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_16c8._M_dataplus._M_p,
                        local_16c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if (local_16e8._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERR: ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_16e8._M_dataplus._M_p,
                        local_16e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
    operator_delete(local_16e8._M_dataplus._M_p,
                    CONCAT71(local_16e8.field_2._M_allocated_capacity._1_7_,
                             local_16e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16c8._M_dataplus._M_p != &local_16c8.field_2) {
    operator_delete(local_16c8._M_dataplus._M_p,
                    CONCAT71(local_16c8.field_2._M_allocated_capacity._1_7_,
                             local_16c8.field_2._M_local_buf[0]) + 1);
  }
  tinyusdz::Stage::~Stage(&local_1688);
  return bVar1 - 1;
}

Assistant:

int main(int argc, char **argv)
{
  tinyusdz::Stage stage; // empty scene

  SimpleScene(&stage);

  std::string warn;
  std::string err;
  bool ret = tinyusdz::usda::SaveAsUSDA("output.usda", stage, &warn, &err);

  if (warn.size()) {
    std::cout << "WARN: " << warn << "\n";
  }

  if (err.size()) {
    std::cerr << "ERR: " << err << "\n";
  }

  return ret ? EXIT_SUCCESS : -1;
}